

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# logger.h
# Opt level: O0

void __thiscall
spdlog::logger::log_<int,int,int>
          (logger *this,source_loc loc,level_enum lvl,string_view_t fmt,int *args,int *args_1,
          int *args_2)

{
  string_view fmt_00;
  string_view_t msg;
  remove_cvref_t<fmt::v11::basic_appender<char>_> rVar1;
  char *s;
  size_t sVar2;
  undefined8 in_RCX;
  undefined8 in_RDX;
  char *in_RDI;
  undefined4 *in_R8;
  undefined4 *in_R9;
  time_point in_stack_00000020;
  exception *ex;
  log_msg log_msg;
  memory_buf_t buf;
  bool traceback_enabled;
  bool log_enabled;
  int ignore;
  string_view sv;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffaa8;
  basic_memory_buffer<char,_250UL,_fmt::v11::detail::allocator<char>_> *in_stack_fffffffffffffab0;
  logger *in_stack_fffffffffffffab8;
  log_msg *log_msg_00;
  logger *in_stack_fffffffffffffac0;
  basic_appender<char> *in_stack_fffffffffffffae8;
  format_args in_stack_fffffffffffffaf0;
  char *in_stack_fffffffffffffb00;
  buffer<char> *this_00;
  size_t in_stack_fffffffffffffb08;
  level_enum lvl_00;
  log_msg *this_01;
  size_t in_stack_fffffffffffffb30;
  string_view_t in_stack_fffffffffffffb38;
  source_loc in_stack_fffffffffffffb50;
  basic_string_view<char> local_438 [2];
  char *local_418;
  size_t sStack_410;
  log_msg *local_408;
  buffer<char> *local_3a0;
  undefined4 local_398 [4];
  undefined4 local_388 [4];
  undefined4 local_378 [4];
  undefined8 local_368;
  undefined4 *local_360;
  undefined8 local_358;
  undefined8 local_350;
  basic_appender<char> local_348 [4];
  buffer<char> local_328 [9];
  undefined1 local_202;
  byte local_201;
  undefined4 *local_200;
  undefined4 *local_1f8;
  undefined8 local_1e0;
  undefined8 local_1d8;
  duration local_1d0;
  undefined4 *local_1c8;
  undefined4 *local_1c0;
  undefined4 *local_1b8;
  undefined8 *local_1b0;
  undefined4 local_5c;
  undefined4 *local_58;
  undefined4 local_4c;
  undefined4 *local_48;
  undefined4 local_3c;
  undefined4 *local_38;
  
  this_01 = (log_msg *)&stack0x00000008;
  local_200 = in_R9;
  local_1f8 = in_R8;
  local_1e0 = in_RDX;
  local_1d8 = in_RCX;
  local_201 = should_log(in_stack_fffffffffffffab8,
                         (level_enum)((ulong)in_stack_fffffffffffffab0 >> 0x20));
  local_202 = details::backtracer::enabled((backtracer *)0x153f61);
  if (((local_201 & 1) != 0) || ((bool)local_202)) {
    ::fmt::v11::basic_memory_buffer<char,_250UL,_fmt::v11::detail::allocator<char>_>::
    basic_memory_buffer(in_stack_fffffffffffffab0,(allocator<char> *)in_stack_fffffffffffffaa8);
    ::fmt::v11::basic_appender<char>::basic_appender(local_348,local_328);
    local_358 = local_1e0;
    local_350 = local_1d8;
    local_1c0 = local_1f8;
    local_1c8 = local_200;
    local_1d0 = in_stack_00000020.__d.__r;
    local_3c = *local_1f8;
    local_38 = local_398;
    local_48 = local_388;
    local_4c = *local_200;
    local_58 = local_378;
    local_5c = *(undefined4 *)in_stack_00000020.__d.__r;
    local_1b0 = &local_368;
    local_1b8 = local_398;
    local_368 = 0x111;
    fmt_00.size_ = in_stack_fffffffffffffb08;
    fmt_00.data_ = in_stack_fffffffffffffb00;
    local_398[0] = local_3c;
    local_388[0] = local_4c;
    local_378[0] = local_5c;
    local_360 = local_1b8;
    rVar1 = ::fmt::v11::vformat_to<fmt::v11::basic_appender<char>,_0>
                      (in_stack_fffffffffffffae8,fmt_00,in_stack_fffffffffffffaf0);
    local_408 = *(log_msg **)&this_01->level;
    local_418 = (this_01->logger_name).data_;
    sStack_410 = (this_01->logger_name).size_;
    local_3a0 = rVar1.container;
    ::fmt::v11::basic_string_view<char>::
    basic_string_view<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0>
              ((basic_string_view<char> *)in_stack_fffffffffffffab0,in_stack_fffffffffffffaa8);
    lvl_00 = (level_enum)((ulong)rVar1.container >> 0x20);
    this_00 = local_328;
    s = ::fmt::v11::detail::buffer<char>::data(this_00);
    sVar2 = ::fmt::v11::detail::buffer<char>::size(this_00);
    ::fmt::v11::basic_string_view<char>::basic_string_view(local_438,s,sVar2);
    msg.size_ = in_stack_fffffffffffffb30;
    msg.data_ = in_RDI;
    sVar2 = sStack_410;
    log_msg_00 = local_408;
    details::log_msg::log_msg
              (this_01,in_stack_fffffffffffffb50,in_stack_fffffffffffffb38,lvl_00,msg);
    log_it_(in_stack_fffffffffffffac0,log_msg_00,SUB81(sVar2 >> 0x38,0),SUB81(sVar2 >> 0x30,0));
    ::fmt::v11::basic_memory_buffer<char,_250UL,_fmt::v11::detail::allocator<char>_>::
    ~basic_memory_buffer
              ((basic_memory_buffer<char,_250UL,_fmt::v11::detail::allocator<char>_> *)0x154218);
  }
  return;
}

Assistant:

void log_(source_loc loc, level::level_enum lvl, string_view_t fmt, Args &&...args) {
        bool log_enabled = should_log(lvl);
        bool traceback_enabled = tracer_.enabled();
        if (!log_enabled && !traceback_enabled) {
            return;
        }
        SPDLOG_TRY {
            memory_buf_t buf;
#ifdef SPDLOG_USE_STD_FORMAT
            fmt_lib::vformat_to(std::back_inserter(buf), fmt, fmt_lib::make_format_args(args...));
#else
            fmt::vformat_to(fmt::appender(buf), fmt, fmt::make_format_args(args...));
#endif

            details::log_msg log_msg(loc, name_, lvl, string_view_t(buf.data(), buf.size()));
            log_it_(log_msg, log_enabled, traceback_enabled);
        }